

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.h
# Opt level: O2

uint uWS::HttpParser::getHeaders(char *postPaddedBuffer,char *end,Header *headers,BloomFilter *bf)

{
  byte bVar1;
  void *pvVar2;
  byte *pbVar3;
  long lVar4;
  uint i;
  int iVar5;
  byte *__s;
  byte *pbVar6;
  int local_38;
  
  iVar5 = 0;
  pbVar3 = (byte *)postPaddedBuffer;
  do {
    if (iVar5 == 0x32) {
      return 0;
    }
    lVar4 = 0;
    pbVar6 = pbVar3;
    for (__s = pbVar3; (bVar1 = *__s, bVar1 != 0x3a && (' ' < (char)bVar1)); __s = __s + 1) {
      *__s = bVar1 | 0x20;
      lVar4 = lVar4 + -1;
      pbVar6 = pbVar6 + 1;
    }
    if (bVar1 == 0xd) {
      if (iVar5 == 0) {
        return 0;
      }
      if (__s == (byte *)end) {
        return 0;
      }
      if (__s[1] == 10) {
        local_38 = (int)postPaddedBuffer;
        (headers->key)._M_len = 0;
        (headers->key)._M_str = (char *)0x0;
        return (((int)pbVar3 - local_38) - (int)lVar4) + 2;
      }
      return 0;
    }
    (headers->key)._M_len = -lVar4;
    (headers->key)._M_str = (char *)pbVar3;
    do {
      bVar1 = __s[1];
      __s = __s + 1;
      pbVar6 = pbVar6 + 1;
      if (bVar1 == 0xd) break;
    } while (bVar1 == 0x3a || (char)bVar1 < '!');
    pvVar2 = memchr(__s,0xd,(long)end - (long)pbVar6);
    if (pvVar2 == (void *)0x0) {
      return 0;
    }
    if (*(char *)((long)pvVar2 + 1) != '\n') {
      return 0;
    }
    (headers->value)._M_len = (long)pvVar2 - (long)pbVar6;
    (headers->value)._M_str = (char *)__s;
    pbVar3 = (byte *)((long)pvVar2 + 2);
    headers = headers + 1;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

static unsigned int getHeaders(char *postPaddedBuffer, char *end, struct HttpRequest::Header *headers, BloomFilter *bf) {
        char *preliminaryKey, *preliminaryValue, *start = postPaddedBuffer;

        for (unsigned int i = 0; i < HttpRequest::MAX_HEADERS; i++) {
            for (preliminaryKey = postPaddedBuffer; (*postPaddedBuffer != ':') & (*postPaddedBuffer > 32); *(postPaddedBuffer++) |= 32);
            if (*postPaddedBuffer == '\r') {
                if ((postPaddedBuffer != end) & (postPaddedBuffer[1] == '\n') & (i > 0)) {
                    headers->key = std::string_view(nullptr, 0);
                    return (unsigned int) ((postPaddedBuffer + 2) - start);
                } else {
                    return 0;
                }
            } else {
                headers->key = std::string_view(preliminaryKey, (size_t) (postPaddedBuffer - preliminaryKey));
                for (postPaddedBuffer++; (*postPaddedBuffer == ':' || *postPaddedBuffer < 33) && *postPaddedBuffer != '\r'; postPaddedBuffer++);
                preliminaryValue = postPaddedBuffer;
                postPaddedBuffer = (char *) memchr(postPaddedBuffer, '\r', end - postPaddedBuffer);
                if (postPaddedBuffer && postPaddedBuffer[1] == '\n') {
                    headers->value = std::string_view(preliminaryValue, (size_t) (postPaddedBuffer - preliminaryValue));
                    postPaddedBuffer += 2;
                    headers++;
                } else {
                    return 0;
                }
            }
        }
        return 0;
    }